

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adt.c
# Opt level: O0

msocket_adt_error_t
msocket_bytearray_append(msocket_bytearray_t *self,uint8_t *pData,uint32_t u32DataLen)

{
  uint8_t *pEnd;
  uint8_t *pNext;
  msocket_adt_error_t errorCode;
  uint32_t u32DataLen_local;
  uint8_t *pData_local;
  msocket_bytearray_t *self_local;
  
  if (((self == (msocket_bytearray_t *)0x0) || (pData == (uint8_t *)0x0)) || (u32DataLen == 0)) {
    self_local._7_1_ = '\x01';
  }
  else {
    self_local._7_1_ = msocket_bytearray_reserve(self,self->u32CurLen + u32DataLen);
    if (self_local._7_1_ == '\0') {
      if (self->pData + self->u32AllocLen < self->pData + self->u32CurLen + u32DataLen) {
        __assert_fail("pNext + u32DataLen <= pEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/msocket/src/msocket_adt.c"
                      ,0x54,
                      "msocket_adt_error_t msocket_bytearray_append(msocket_bytearray_t *, const uint8_t *, uint32_t)"
                     );
      }
      memcpy(self->pData + self->u32CurLen,pData,(ulong)u32DataLen);
      self->u32CurLen = u32DataLen + self->u32CurLen;
    }
  }
  return self_local._7_1_;
}

Assistant:

msocket_adt_error_t msocket_bytearray_append(msocket_bytearray_t *self, const uint8_t *pData, uint32_t u32DataLen){
   if(self && pData && (u32DataLen > 0)){
      msocket_adt_error_t errorCode = msocket_bytearray_reserve(self, self->u32CurLen + u32DataLen);
      if(errorCode == ADT_NO_ERROR){
         uint8_t *pNext, *pEnd;
         pNext = self->pData + self->u32CurLen;
         pEnd = self->pData + self->u32AllocLen;
         assert(pNext + u32DataLen <= pEnd);
         memcpy(pNext,pData,u32DataLen);
         self->u32CurLen+=u32DataLen;
      }
      return errorCode;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}